

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O0

bool __thiscall Hasher::operator()(Hasher *this,string *a,string *b)

{
  __type _Var1;
  long in_RDI;
  
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          a);
  return _Var1;
}

Assistant:

bool operator()(const string& a, const string& b) const {
    num_compares_++;
    return a == b;
  }